

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.cpp
# Opt level: O2

error_code __thiscall
simdjson::fallback::implementation::minify
          (implementation *this,uint8_t *buf,size_t len,uint8_t *dst,size_t *dst_len)

{
  long lVar1;
  byte bVar2;
  error_code eVar3;
  byte bVar4;
  size_t sVar5;
  size_t sVar6;
  
  bVar4 = 1;
  bVar2 = 0;
  sVar5 = 0;
  for (sVar6 = 0; len != sVar6; sVar6 = sVar6 + 1) {
    lVar1 = (ulong)buf[sVar6] * 3;
    bVar2 = bVar2 ^ jump_table[lVar1] & bVar4;
    dst[sVar5] = buf[sVar6];
    sVar5 = sVar5 + (jump_table[lVar1 + 2] | bVar2);
    bVar4 = ~bVar4 | jump_table[lVar1 + 1];
  }
  *dst_len = sVar5;
  eVar3 = UNCLOSED_STRING;
  if (bVar2 == 0) {
    eVar3 = SUCCESS;
  }
  return eVar3;
}

Assistant:

simdjson_warn_unused error_code implementation::minify(const uint8_t *buf, size_t len, uint8_t *dst, size_t &dst_len) const noexcept {
  size_t i = 0, pos = 0;
  uint8_t quote = 0;
  uint8_t nonescape = 1;

  while (i < len) {
    unsigned char c = buf[i];
    uint8_t *meta = jump_table + 3 * c;

    quote = quote ^ (meta[0] & nonescape);
    dst[pos] = c;
    pos += meta[2] | quote;

    i += 1;
    nonescape = uint8_t(~nonescape) | (meta[1]);
  }
  dst_len = pos; // we intentionally do not work with a reference
  // for fear of aliasing
  return quote ? UNCLOSED_STRING : SUCCESS;
}